

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rtreeCheckMapping(RtreeCheck *pCheck,int bLeaf,i64 iKey,i64 iVal)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  Mem *pMem;
  i64 iVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)bLeaf;
  pStmt = pCheck->aCheckMapping[uVar4];
  if (pStmt == (sqlite3_stmt *)0x0) {
    pStmt = rtreeCheckPrepare(pCheck,&DAT_001deeb4 + *(int *)(&DAT_001deeb4 + uVar4 * 4),pCheck->zDb
                              ,pCheck->zTab);
    pCheck->aCheckMapping[uVar4] = pStmt;
  }
  if (pCheck->rc == 0) {
    sqlite3_bind_int64(pStmt,1,iKey);
    iVar1 = sqlite3_step(pStmt);
    if (iVar1 == 100) {
      pMem = columnMem(pStmt,0);
      iVar2 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure(pStmt);
      if (iVar2 != iVal) {
        pcVar3 = "%_rowid";
        if (bLeaf == 0) {
          pcVar3 = "%_parent";
        }
        rtreeCheckAppendMsg(pCheck,"Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",iKey,
                            iVar2,pcVar3,iKey,iVal);
      }
    }
    else if (iVar1 == 0x65) {
      pcVar3 = "%_rowid";
      if (bLeaf == 0) {
        pcVar3 = "%_parent";
      }
      rtreeCheckAppendMsg(pCheck,"Mapping (%lld -> %lld) missing from %s table",iKey,iVal,pcVar3);
    }
    iVar1 = sqlite3_reset(pStmt);
    if (pCheck->rc == 0) {
      pCheck->rc = iVar1;
    }
  }
  return;
}

Assistant:

static void rtreeCheckMapping(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  int bLeaf,                      /* True for a leaf cell, false for interior */
  i64 iKey,                       /* Key for mapping */
  i64 iVal                        /* Expected value for mapping */
){
  int rc;
  sqlite3_stmt *pStmt;
  const char *azSql[2] = {
    "SELECT parentnode FROM %Q.'%q_parent' WHERE nodeno=?1",
    "SELECT nodeno FROM %Q.'%q_rowid' WHERE rowid=?1"
  };

  assert( bLeaf==0 || bLeaf==1 );
  if( pCheck->aCheckMapping[bLeaf]==0 ){
    pCheck->aCheckMapping[bLeaf] = rtreeCheckPrepare(pCheck,
        azSql[bLeaf], pCheck->zDb, pCheck->zTab
    );
  }
  if( pCheck->rc!=SQLITE_OK ) return;

  pStmt = pCheck->aCheckMapping[bLeaf];
  sqlite3_bind_int64(pStmt, 1, iKey);
  rc = sqlite3_step(pStmt);
  if( rc==SQLITE_DONE ){
    rtreeCheckAppendMsg(pCheck, "Mapping (%lld -> %lld) missing from %s table",
        iKey, iVal, (bLeaf ? "%_rowid" : "%_parent")
    );
  }else if( rc==SQLITE_ROW ){
    i64 ii = sqlite3_column_int64(pStmt, 0);
    if( ii!=iVal ){
      rtreeCheckAppendMsg(pCheck, 
          "Found (%lld -> %lld) in %s table, expected (%lld -> %lld)",
          iKey, ii, (bLeaf ? "%_rowid" : "%_parent"), iKey, iVal
      );
    }
  }
  rtreeCheckReset(pCheck, pStmt);
}